

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O2

cram_block * cram_encode_slice_header(cram_fd *fd,cram_slice *s)

{
  uint uVar1;
  ulong uVar2;
  undefined8 uVar3;
  byte bVar4;
  int iVar5;
  cram_block *b;
  byte *pbVar6;
  long lVar7;
  cram_block_slice_hdr *pcVar8;
  long lVar9;
  int32_t iVar10;
  byte *pbVar11;
  long lStack_40;
  
  b = cram_new_block(MAPPED_SLICE,0);
  if (b != (cram_block *)0x0) {
    pcVar8 = s->hdr;
    pbVar6 = (byte *)malloc((long)(pcVar8->num_blocks * 5 + 0x38));
    if (pbVar6 != (byte *)0x0) {
      uVar1 = pcVar8->ref_seq_id;
      if (uVar1 < 0x80) {
        *pbVar6 = (byte)uVar1;
        lVar7 = 1;
      }
      else if (uVar1 < 0x4000) {
        lVar7 = 2;
        *pbVar6 = (byte)(uVar1 >> 8) | 0x80;
        pbVar6[1] = (byte)pcVar8->ref_seq_id;
      }
      else if (uVar1 < 0x200000) {
        lVar7 = 3;
        *pbVar6 = (byte)(uVar1 >> 0x10) | 0xc0;
        pbVar6[1] = *(byte *)((long)&pcVar8->ref_seq_id + 1);
        pbVar6[2] = (byte)pcVar8->ref_seq_id;
      }
      else {
        bVar4 = (byte)(uVar1 >> 0x18);
        if (uVar1 < 0x10000000) {
          lVar7 = 4;
          *pbVar6 = bVar4 | 0xe0;
          pbVar6[1] = *(byte *)((long)&pcVar8->ref_seq_id + 2);
          pbVar6[2] = *(byte *)((long)&pcVar8->ref_seq_id + 1);
          pbVar6[3] = (byte)pcVar8->ref_seq_id;
        }
        else {
          lVar7 = 5;
          *pbVar6 = bVar4 >> 4 | 0xf0;
          pbVar6[1] = (byte)((uint)pcVar8->ref_seq_id >> 0x14);
          pbVar6[2] = (byte)((uint)pcVar8->ref_seq_id >> 0xc);
          pbVar6[3] = (byte)((uint)pcVar8->ref_seq_id >> 4);
          pbVar6[4] = (byte)pcVar8->ref_seq_id & 0xf;
        }
      }
      pbVar11 = pbVar6 + lVar7;
      uVar1 = pcVar8->ref_seq_start;
      if (uVar1 < 0x80) {
        *pbVar11 = (byte)uVar1;
        lStack_40 = 1;
      }
      else if (uVar1 < 0x4000) {
        *pbVar11 = (byte)(uVar1 >> 8) | 0x80;
        pbVar11[1] = (byte)pcVar8->ref_seq_start;
        lStack_40 = 2;
      }
      else if (uVar1 < 0x200000) {
        *pbVar11 = (byte)(uVar1 >> 0x10) | 0xc0;
        pbVar11[1] = *(byte *)((long)&pcVar8->ref_seq_start + 1);
        pbVar11[2] = (byte)pcVar8->ref_seq_start;
        lStack_40 = 3;
      }
      else {
        bVar4 = (byte)(uVar1 >> 0x18);
        if (uVar1 < 0x10000000) {
          *pbVar11 = bVar4 | 0xe0;
          pbVar11[1] = *(byte *)((long)&pcVar8->ref_seq_start + 2);
          pbVar11[2] = *(byte *)((long)&pcVar8->ref_seq_start + 1);
          pbVar11[3] = (byte)pcVar8->ref_seq_start;
          lStack_40 = 4;
        }
        else {
          *pbVar11 = bVar4 >> 4 | 0xf0;
          pbVar11[1] = (byte)((uint)pcVar8->ref_seq_start >> 0x14);
          pbVar11[2] = (byte)((uint)pcVar8->ref_seq_start >> 0xc);
          pbVar11[3] = (byte)((uint)pcVar8->ref_seq_start >> 4);
          pbVar11[4] = (byte)pcVar8->ref_seq_start & 0xf;
          lStack_40 = 5;
        }
      }
      pbVar11 = pbVar11 + lStack_40;
      uVar1 = pcVar8->ref_seq_span;
      if (uVar1 < 0x80) {
        *pbVar11 = (byte)uVar1;
        lStack_40 = 1;
      }
      else if (uVar1 < 0x4000) {
        *pbVar11 = (byte)(uVar1 >> 8) | 0x80;
        pbVar11[1] = (byte)pcVar8->ref_seq_span;
        lStack_40 = 2;
      }
      else if (uVar1 < 0x200000) {
        *pbVar11 = (byte)(uVar1 >> 0x10) | 0xc0;
        pbVar11[1] = *(byte *)((long)&pcVar8->ref_seq_span + 1);
        pbVar11[2] = (byte)pcVar8->ref_seq_span;
        lStack_40 = 3;
      }
      else {
        bVar4 = (byte)(uVar1 >> 0x18);
        if (uVar1 < 0x10000000) {
          *pbVar11 = bVar4 | 0xe0;
          pbVar11[1] = *(byte *)((long)&pcVar8->ref_seq_span + 2);
          pbVar11[2] = *(byte *)((long)&pcVar8->ref_seq_span + 1);
          pbVar11[3] = (byte)pcVar8->ref_seq_span;
          lStack_40 = 4;
        }
        else {
          *pbVar11 = bVar4 >> 4 | 0xf0;
          pbVar11[1] = (byte)((uint)pcVar8->ref_seq_span >> 0x14);
          pbVar11[2] = (byte)((uint)pcVar8->ref_seq_span >> 0xc);
          pbVar11[3] = (byte)((uint)pcVar8->ref_seq_span >> 4);
          pbVar11[4] = (byte)pcVar8->ref_seq_span & 0xf;
          lStack_40 = 5;
        }
      }
      pbVar11 = pbVar11 + lStack_40;
      uVar1 = pcVar8->num_records;
      if (uVar1 < 0x80) {
        *pbVar11 = (byte)uVar1;
        lStack_40 = 1;
      }
      else if (uVar1 < 0x4000) {
        *pbVar11 = (byte)(uVar1 >> 8) | 0x80;
        pbVar11[1] = (byte)pcVar8->num_records;
        lStack_40 = 2;
      }
      else if (uVar1 < 0x200000) {
        *pbVar11 = (byte)(uVar1 >> 0x10) | 0xc0;
        pbVar11[1] = *(byte *)((long)&pcVar8->num_records + 1);
        pbVar11[2] = (byte)pcVar8->num_records;
        lStack_40 = 3;
      }
      else {
        bVar4 = (byte)(uVar1 >> 0x18);
        if (uVar1 < 0x10000000) {
          *pbVar11 = bVar4 | 0xe0;
          pbVar11[1] = *(byte *)((long)&pcVar8->num_records + 2);
          pbVar11[2] = *(byte *)((long)&pcVar8->num_records + 1);
          pbVar11[3] = (byte)pcVar8->num_records;
          lStack_40 = 4;
        }
        else {
          *pbVar11 = bVar4 >> 4 | 0xf0;
          pbVar11[1] = (byte)((uint)pcVar8->num_records >> 0x14);
          pbVar11[2] = (byte)((uint)pcVar8->num_records >> 0xc);
          pbVar11[3] = (byte)((uint)pcVar8->num_records >> 4);
          pbVar11[4] = (byte)pcVar8->num_records & 0xf;
          lStack_40 = 5;
        }
      }
      pbVar11 = pbVar11 + lStack_40;
      iVar5 = fd->version >> 8;
      if (iVar5 == 2) {
        uVar2 = pcVar8->record_counter;
        if (uVar2 < 0x80) {
          *pbVar11 = (byte)uVar2;
          lStack_40 = 1;
        }
        else if (uVar2 < 0x4000) {
          *pbVar11 = (byte)(uVar2 >> 8) | 0x80;
          pbVar11[1] = (byte)pcVar8->record_counter;
          lStack_40 = 2;
        }
        else if (uVar2 < 0x200000) {
          *pbVar11 = (byte)(uVar2 >> 0x10) | 0xc0;
          pbVar11[1] = *(byte *)((long)&pcVar8->record_counter + 1);
          pbVar11[2] = (byte)pcVar8->record_counter;
          lStack_40 = 3;
        }
        else {
          bVar4 = (byte)(uVar2 >> 0x18);
          if (uVar2 < 0x10000000) {
            *pbVar11 = bVar4 | 0xe0;
            pbVar11[1] = *(byte *)((long)&pcVar8->record_counter + 2);
            pbVar11[2] = *(byte *)((long)&pcVar8->record_counter + 1);
            pbVar11[3] = (byte)pcVar8->record_counter;
            lStack_40 = 4;
          }
          else {
            *pbVar11 = bVar4 >> 4 | 0xf0;
            pbVar11[1] = (byte)((uint)pcVar8->record_counter >> 0x14);
            pbVar11[2] = (byte)((uint)pcVar8->record_counter >> 0xc);
            pbVar11[3] = (byte)((uint)pcVar8->record_counter >> 4);
            pbVar11[4] = (byte)pcVar8->record_counter & 0xf;
            lStack_40 = 5;
          }
        }
        pbVar11 = pbVar11 + lStack_40;
      }
      else if (2 < iVar5) {
        iVar5 = ltf8_put((char *)pbVar11,pcVar8->record_counter);
        pbVar11 = pbVar11 + iVar5;
        pcVar8 = s->hdr;
      }
      uVar1 = pcVar8->num_blocks;
      if (uVar1 < 0x80) {
        *pbVar11 = (byte)uVar1;
        lStack_40 = 1;
      }
      else if (uVar1 < 0x4000) {
        *pbVar11 = (byte)(uVar1 >> 8) | 0x80;
        pbVar11[1] = (byte)pcVar8->num_blocks;
        lStack_40 = 2;
      }
      else if (uVar1 < 0x200000) {
        *pbVar11 = (byte)(uVar1 >> 0x10) | 0xc0;
        pbVar11[1] = *(byte *)((long)&pcVar8->num_blocks + 1);
        pbVar11[2] = (byte)pcVar8->num_blocks;
        lStack_40 = 3;
      }
      else {
        bVar4 = (byte)(uVar1 >> 0x18);
        if (uVar1 < 0x10000000) {
          *pbVar11 = bVar4 | 0xe0;
          pbVar11[1] = *(byte *)((long)&pcVar8->num_blocks + 2);
          pbVar11[2] = *(byte *)((long)&pcVar8->num_blocks + 1);
          pbVar11[3] = (byte)pcVar8->num_blocks;
          lStack_40 = 4;
        }
        else {
          *pbVar11 = bVar4 >> 4 | 0xf0;
          pbVar11[1] = (byte)((uint)pcVar8->num_blocks >> 0x14);
          pbVar11[2] = (byte)((uint)pcVar8->num_blocks >> 0xc);
          pbVar11[3] = (byte)((uint)pcVar8->num_blocks >> 4);
          pbVar11[4] = (byte)pcVar8->num_blocks & 0xf;
          lStack_40 = 5;
        }
      }
      pbVar11 = pbVar11 + lStack_40;
      uVar1 = pcVar8->num_content_ids;
      if (uVar1 < 0x80) {
        *pbVar11 = (byte)uVar1;
        lStack_40 = 1;
      }
      else if (uVar1 < 0x4000) {
        *pbVar11 = (byte)(uVar1 >> 8) | 0x80;
        pbVar11[1] = (byte)pcVar8->num_content_ids;
        lStack_40 = 2;
      }
      else if (uVar1 < 0x200000) {
        *pbVar11 = (byte)(uVar1 >> 0x10) | 0xc0;
        pbVar11[1] = *(byte *)((long)&pcVar8->num_content_ids + 1);
        pbVar11[2] = (byte)pcVar8->num_content_ids;
        lStack_40 = 3;
      }
      else {
        bVar4 = (byte)(uVar1 >> 0x18);
        if (uVar1 < 0x10000000) {
          *pbVar11 = bVar4 | 0xe0;
          pbVar11[1] = *(byte *)((long)&pcVar8->num_content_ids + 2);
          pbVar11[2] = *(byte *)((long)&pcVar8->num_content_ids + 1);
          pbVar11[3] = (byte)pcVar8->num_content_ids;
          lStack_40 = 4;
        }
        else {
          *pbVar11 = bVar4 >> 4 | 0xf0;
          pbVar11[1] = (byte)((uint)pcVar8->num_content_ids >> 0x14);
          pbVar11[2] = (byte)((uint)pcVar8->num_content_ids >> 0xc);
          pbVar11[3] = (byte)((uint)pcVar8->num_content_ids >> 4);
          pbVar11[4] = (byte)pcVar8->num_content_ids & 0xf;
          lStack_40 = 5;
        }
      }
      pbVar11 = pbVar11 + lStack_40;
      for (lVar7 = 0; lVar7 < pcVar8->num_content_ids; lVar7 = lVar7 + 1) {
        uVar1 = pcVar8->block_content_ids[lVar7];
        if (uVar1 < 0x80) {
          *pbVar11 = (byte)uVar1;
          lVar9 = 1;
        }
        else if (uVar1 < 0x4000) {
          *pbVar11 = (byte)(uVar1 >> 8) | 0x80;
          pbVar11[1] = *(byte *)(s->hdr->block_content_ids + lVar7);
          lVar9 = 2;
        }
        else if (uVar1 < 0x200000) {
          *pbVar11 = (byte)(uVar1 >> 0x10) | 0xc0;
          pbVar11[1] = *(byte *)((long)s->hdr->block_content_ids + lVar7 * 4 + 1);
          pbVar11[2] = *(byte *)(s->hdr->block_content_ids + lVar7);
          lVar9 = 3;
        }
        else {
          bVar4 = (byte)(uVar1 >> 0x18);
          if (uVar1 < 0x10000000) {
            *pbVar11 = bVar4 | 0xe0;
            pbVar11[1] = *(byte *)((long)s->hdr->block_content_ids + lVar7 * 4 + 2);
            pbVar11[2] = *(byte *)((long)s->hdr->block_content_ids + lVar7 * 4 + 1);
            pbVar11[3] = *(byte *)(s->hdr->block_content_ids + lVar7);
            lVar9 = 4;
          }
          else {
            *pbVar11 = bVar4 >> 4 | 0xf0;
            pbVar11[1] = (byte)((uint)s->hdr->block_content_ids[lVar7] >> 0x14);
            pbVar11[2] = (byte)((uint)s->hdr->block_content_ids[lVar7] >> 0xc);
            pbVar11[3] = (byte)((uint)s->hdr->block_content_ids[lVar7] >> 4);
            pbVar11[4] = *(byte *)(s->hdr->block_content_ids + lVar7) & 0xf;
            lVar9 = 5;
          }
        }
        pbVar11 = pbVar11 + lVar9;
        pcVar8 = s->hdr;
      }
      if (pcVar8->content_type == MAPPED_SLICE) {
        uVar1 = pcVar8->ref_base_id;
        if (uVar1 < 0x80) {
          *pbVar11 = (byte)uVar1;
          lStack_40 = 1;
        }
        else if (uVar1 < 0x4000) {
          *pbVar11 = (byte)(uVar1 >> 8) | 0x80;
          pbVar11[1] = (byte)s->hdr->ref_base_id;
          lStack_40 = 2;
        }
        else if (uVar1 < 0x200000) {
          *pbVar11 = (byte)(uVar1 >> 0x10) | 0xc0;
          pbVar11[1] = *(byte *)((long)&s->hdr->ref_base_id + 1);
          pbVar11[2] = (byte)s->hdr->ref_base_id;
          lStack_40 = 3;
        }
        else {
          bVar4 = (byte)(uVar1 >> 0x18);
          if (uVar1 < 0x10000000) {
            *pbVar11 = bVar4 | 0xe0;
            pbVar11[1] = *(byte *)((long)&s->hdr->ref_base_id + 2);
            pbVar11[2] = *(byte *)((long)&s->hdr->ref_base_id + 1);
            pbVar11[3] = (byte)s->hdr->ref_base_id;
            lStack_40 = 4;
          }
          else {
            *pbVar11 = bVar4 >> 4 | 0xf0;
            pbVar11[1] = (byte)((uint)s->hdr->ref_base_id >> 0x14);
            pbVar11[2] = (byte)((uint)s->hdr->ref_base_id >> 0xc);
            pbVar11[3] = (byte)((uint)s->hdr->ref_base_id >> 4);
            pbVar11[4] = (byte)s->hdr->ref_base_id & 0xf;
            lStack_40 = 5;
          }
        }
        pbVar11 = pbVar11 + lStack_40;
        pcVar8 = s->hdr;
      }
      if ((fd->version & 0xffffff00U) != 0x100) {
        uVar3 = *(undefined8 *)(pcVar8->md5 + 8);
        *(undefined8 *)pbVar11 = *(undefined8 *)pcVar8->md5;
        *(undefined8 *)(pbVar11 + 8) = uVar3;
        pbVar11 = pbVar11 + 0x10;
        pcVar8 = s->hdr;
      }
      if ((long)pbVar11 - (long)pbVar6 <= (long)(pcVar8->num_blocks * 5 + 0x38)) {
        b->data = pbVar6;
        iVar10 = (int32_t)((long)pbVar11 - (long)pbVar6);
        b->uncomp_size = iVar10;
        b->comp_size = iVar10;
        return b;
      }
      __assert_fail("cp-buf <= 16+5*(8+s->hdr->num_blocks)",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_encode.c"
                    ,0x2c1,"cram_block *cram_encode_slice_header(cram_fd *, cram_slice *)");
    }
    cram_free_block(b);
  }
  return (cram_block *)0x0;
}

Assistant:

cram_block *cram_encode_slice_header(cram_fd *fd, cram_slice *s) {
    char *buf;
    char *cp;
    cram_block *b = cram_new_block(MAPPED_SLICE, 0);
    int j;

    if (!b)
	return NULL;

    if (NULL == (cp = buf = malloc(16+5*(8+s->hdr->num_blocks)))) {
	cram_free_block(b);
	return NULL;
    }

    cp += itf8_put(cp, s->hdr->ref_seq_id);
    cp += itf8_put(cp, s->hdr->ref_seq_start);
    cp += itf8_put(cp, s->hdr->ref_seq_span);
    cp += itf8_put(cp, s->hdr->num_records);
    if (CRAM_MAJOR_VERS(fd->version) == 2)
	cp += itf8_put(cp, s->hdr->record_counter);
    else if (CRAM_MAJOR_VERS(fd->version) >= 3)
	cp += ltf8_put(cp, s->hdr->record_counter);
    cp += itf8_put(cp, s->hdr->num_blocks);
    cp += itf8_put(cp, s->hdr->num_content_ids);
    for (j = 0; j < s->hdr->num_content_ids; j++) {
	cp += itf8_put(cp, s->hdr->block_content_ids[j]);
    }
    if (s->hdr->content_type == MAPPED_SLICE)
	cp += itf8_put(cp, s->hdr->ref_base_id);

    if (CRAM_MAJOR_VERS(fd->version) != 1) {
	memcpy(cp, s->hdr->md5, 16); cp += 16;
    }
    
    assert(cp-buf <= 16+5*(8+s->hdr->num_blocks));

    b->data = (unsigned char *)buf;
    b->comp_size = b->uncomp_size = cp-buf;

    return b;
}